

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_file.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::FileGenerator::GenerateDescriptorInitializationCodeForMutable
          (FileGenerator *this,Printer *printer)

{
  FileDescriptorProto *this_00;
  size_t *output;
  ClassNameResolver *this_01;
  undefined4 uVar1;
  Printer *pPVar2;
  bool bVar3;
  int iVar4;
  scoped_ptr<google::protobuf::compiler::java::MessageGenerator> *this_02;
  MessageGenerator *pMVar5;
  scoped_ptr<google::protobuf::compiler::java::ExtensionGenerator> *this_03;
  ExtensionGenerator *pEVar6;
  DescriptorPool *alternate_pool;
  size_type sVar7;
  FileDescriptor *pFVar8;
  undefined1 local_1e0 [8];
  string dependency;
  undefined1 local_1b8 [4];
  int i_2;
  undefined1 local_198 [8];
  FieldDescriptorSet extensions;
  string file_data;
  FileDescriptorProto file_proto;
  int local_68;
  int i_1;
  int i;
  string local_58;
  string local_38;
  Printer *local_18;
  Printer *printer_local;
  FileGenerator *this_local;
  
  local_18 = printer;
  printer_local = (Printer *)this;
  io::Printer::Print(printer,
                     "public static com.google.protobuf.Descriptors.FileDescriptor\n    getDescriptor() {\n  return descriptor;\n}\nprivate static final com.google.protobuf.Descriptors.FileDescriptor\n    descriptor;\nstatic {\n"
                    );
  io::Printer::Indent(local_18);
  pPVar2 = local_18;
  FileJavaPackage_abi_cxx11_(&local_38,(java *)this->file_,(FileDescriptor *)0x1,SUB81(local_18,0));
  ClassNameResolver::GetDescriptorClassName_abi_cxx11_(&local_58,this->name_resolver_,this->file_);
  io::Printer::Print(pPVar2,"descriptor = $immutable_package$.$descriptor_classname$.descriptor;\n",
                     "immutable_package",&local_38,"descriptor_classname",&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  for (local_68 = 0; iVar4 = FileDescriptor::message_type_count(this->file_), local_68 < iVar4;
      local_68 = local_68 + 1) {
    this_02 = internal::
              scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::java::MessageGenerator>_>
              ::operator[](&this->message_generators_,(long)local_68);
    pMVar5 = internal::scoped_ptr<google::protobuf::compiler::java::MessageGenerator>::operator->
                       (this_02);
    (*pMVar5->_vptr_MessageGenerator[3])(pMVar5,local_18);
  }
  for (file_proto.source_code_info_._4_4_ = 0; iVar4 = FileDescriptor::extension_count(this->file_),
      file_proto.source_code_info_._4_4_ < iVar4;
      file_proto.source_code_info_._4_4_ = file_proto.source_code_info_._4_4_ + 1) {
    this_03 = internal::
              scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::java::ExtensionGenerator>_>
              ::operator[](&this->extension_generators_,(long)file_proto.source_code_info_._4_4_);
    pEVar6 = internal::scoped_ptr<google::protobuf::compiler::java::ExtensionGenerator>::operator->
                       (this_03);
    (*pEVar6->_vptr_ExtensionGenerator[3])(pEVar6,local_18);
  }
  this_00 = (FileDescriptorProto *)((long)&file_data.field_2 + 8);
  FileDescriptorProto::FileDescriptorProto(this_00);
  FileDescriptor::CopyTo(this->file_,this_00);
  output = &extensions._M_t._M_impl.super__Rb_tree_header._M_node_count;
  std::__cxx11::string::string((string *)output);
  MessageLite::SerializeToString((MessageLite *)((long)&file_data.field_2 + 8),(string *)output);
  std::
  set<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::set((set<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
         *)local_198);
  alternate_pool = FileDescriptor::pool(this->file_);
  anon_unknown_0::CollectExtensions
            ((FileDescriptorProto *)((long)&file_data.field_2 + 8),alternate_pool,
             (FieldDescriptorSet *)local_198,
             (string *)&extensions._M_t._M_impl.super__Rb_tree_header._M_node_count);
  sVar7 = std::
          set<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ::size((set<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  *)local_198);
  pPVar2 = local_18;
  if (sVar7 != 0) {
    ClassNameResolver::GetImmutableClassName<google::protobuf::FileDescriptor>
              ((string *)local_1b8,this->name_resolver_,this->file_);
    io::Printer::Print(pPVar2,
                       "try {\n  java.lang.Class immutableClass = java.lang.Class.forName(\n      \"$immutable_classname$\");\n} catch (java.lang.ClassNotFoundException e) {\n}\n"
                       ,"immutable_classname",(string *)local_1b8);
    std::__cxx11::string::~string((string *)local_1b8);
  }
  for (dependency.field_2._12_4_ = 0; uVar1 = dependency.field_2._12_4_,
      iVar4 = FileDescriptor::dependency_count(this->file_), (int)uVar1 < iVar4;
      dependency.field_2._12_4_ = dependency.field_2._12_4_ + 1) {
    pFVar8 = FileDescriptor::dependency(this->file_,dependency.field_2._12_4_);
    bVar3 = ShouldIncludeDependency(this,pFVar8,false);
    if (bVar3) {
      this_01 = this->name_resolver_;
      pFVar8 = FileDescriptor::dependency(this->file_,dependency.field_2._12_4_);
      ClassNameResolver::GetMutableClassName<google::protobuf::FileDescriptor>
                ((string *)local_1e0,this_01,pFVar8);
      io::Printer::Print(local_18,"$dependency$.getDescriptor();\n","dependency",(string *)local_1e0
                        );
      std::__cxx11::string::~string((string *)local_1e0);
    }
  }
  io::Printer::Outdent(local_18);
  io::Printer::Print(local_18,"}\n");
  std::
  set<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::~set((set<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          *)local_198);
  std::__cxx11::string::~string
            ((string *)&extensions._M_t._M_impl.super__Rb_tree_header._M_node_count);
  FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)((long)&file_data.field_2 + 8));
  return;
}

Assistant:

void FileGenerator::GenerateDescriptorInitializationCodeForMutable(io::Printer* printer) {
  printer->Print(
    "public static com.google.protobuf.Descriptors.FileDescriptor\n"
    "    getDescriptor() {\n"
    "  return descriptor;\n"
    "}\n"
    "private static final com.google.protobuf.Descriptors.FileDescriptor\n"
    "    descriptor;\n"
    "static {\n");
  printer->Indent();

  printer->Print(
    "descriptor = $immutable_package$.$descriptor_classname$.descriptor;\n",
    "immutable_package", FileJavaPackage(file_, true),
    "descriptor_classname", name_resolver_->GetDescriptorClassName(file_));

  for (int i = 0; i < file_->message_type_count(); i++) {
    message_generators_[i]->GenerateStaticVariableInitializers(printer);
  }
  for (int i = 0; i < file_->extension_count(); i++) {
    extension_generators_[i]->GenerateNonNestedInitializationCode(printer);
  }

  // Check if custom options exist. If any, try to load immutable classes since
  // custom options are only represented with immutable messages.
  FileDescriptorProto file_proto;
  file_->CopyTo(&file_proto);
  string file_data;
  file_proto.SerializeToString(&file_data);
  FieldDescriptorSet extensions;
  CollectExtensions(file_proto, *file_->pool(), &extensions, file_data);

  if (extensions.size() > 0) {
    // Try to load immutable messages' outer class. Its initialization code
    // will take care of interpreting custom options.
    printer->Print(
      "try {\n"
      // Note that we have to load the immutable class dynamically here as
      // we want the mutable code to be independent from the immutable code
      // at compile time. It is required to implement dual-compile for
      // mutable and immutable API in blaze.
      "  java.lang.Class immutableClass = java.lang.Class.forName(\n"
      "      \"$immutable_classname$\");\n"
      "} catch (java.lang.ClassNotFoundException e) {\n"
      // The immutable class can not be found. Custom options are left
      // as unknown fields.
      // TODO(xiaofeng): inform the user with a warning?
      "}\n",
      "immutable_classname", name_resolver_->GetImmutableClassName(file_));
  }

  // Force descriptor initialization of all dependencies.
  for (int i = 0; i < file_->dependency_count(); i++) {
    if (ShouldIncludeDependency(file_->dependency(i), false)) {
      string dependency = name_resolver_->GetMutableClassName(
          file_->dependency(i));
      printer->Print(
        "$dependency$.getDescriptor();\n",
        "dependency", dependency);
    }
  }

  printer->Outdent();
  printer->Print(
    "}\n");
}